

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

t_operand __thiscall
xemmai::ast::t_break::f_emit(t_break *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  size_t sVar1;
  t_targets *ptVar2;
  t_node *ptVar3;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  ulong uVar4;
  t_operand tVar5;
  t_null local_38;
  
  sVar1 = a_emit->v_stack;
  ptVar2 = a_emit->v_targets;
  a_emit->v_stack = ptVar2->v_break_stack;
  ptVar3 = (this->v_expression)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  if (ptVar3 == (t_node *)0x0) {
    if (ptVar2->v_break_must_clear == false) {
      local_38.super_t_node.v_at.v_position = (this->super_t_node).v_at.v_position;
      local_38.super_t_node.v_at.v_line = (this->super_t_node).v_at.v_line;
      local_38.super_t_node.v_at.v_column = (this->super_t_node).v_at.v_column;
      local_38.super_t_node._vptr_t_node = (_func_int **)&PTR__t_node_0019b1c0;
      t_null::f_emit(&local_38,a_emit,ptVar2->v_break_is_tail,false,false);
    }
  }
  else {
    (*ptVar3->_vptr_t_node[3])
              (ptVar3,a_emit,(ulong)ptVar2->v_break_is_tail,0,(ulong)ptVar2->v_break_must_clear);
  }
  a_emit->v_stack = sVar1;
  if (!a_clear) {
    uVar4 = sVar1 + 1;
    a_emit->v_stack = uVar4;
    if (a_emit->v_code->v_size < uVar4) {
      a_emit->v_code->v_size = uVar4;
    }
  }
  t_emit::f_join(a_emit,a_emit->v_targets->v_break_junction);
  local_38.super_t_node._vptr_t_node = (_func_int **)*t_code::v_labels;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             (void **)&local_38);
  t_emit::operator<<(a_emit,a_emit->v_targets->v_break);
  tVar5.field_1.v_integer = extraout_RDX.v_integer;
  tVar5._0_8_ = 4;
  return tVar5;
}

Assistant:

t_operand t_break::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	auto stack = a_emit.v_stack;
	a_emit.v_stack = a_emit.v_targets->v_break_stack;
	if (v_expression)
		v_expression->f_emit(a_emit, a_emit.v_targets->v_break_is_tail, false, a_emit.v_targets->v_break_must_clear);
	else if (!a_emit.v_targets->v_break_must_clear)
		t_null(v_at).f_emit(a_emit, a_emit.v_targets->v_break_is_tail, false, false);
	a_emit.v_stack = stack;
	if (!a_clear) a_emit.f_push();
	a_emit.f_join(*a_emit.v_targets->v_break_junction);
	a_emit << c_instruction__JUMP << *a_emit.v_targets->v_break;
	return {};
}